

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::ForwardTypeRestrictionSyntax>
          (DeepCloneVisitor *this,ForwardTypeRestrictionSyntax *node,BumpAllocator *alloc)

{
  ForwardTypeRestrictionSyntax *pFVar1;
  Token local_38;
  Token local_28;
  
  local_28 = parsing::Token::deepClone(&node->keyword1,alloc);
  local_38 = parsing::Token::deepClone(&node->keyword2,alloc);
  pFVar1 = BumpAllocator::
           emplace<slang::syntax::ForwardTypeRestrictionSyntax,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_28,&local_38);
  return &pFVar1->super_SyntaxNode;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }